

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool apply_paint(render_state_t *state,render_context_t *context,paint_t *paint)

{
  paint_type_t pVar1;
  bool bVar2;
  units_type_t uVar3;
  length_type_t lVar4;
  render_state_t *prVar5;
  _Bool _Var6;
  element_t *peVar7;
  element_t *peVar8;
  attribute *paVar9;
  int i;
  int iVar10;
  uint uVar11;
  gradient_stop_array_t *color;
  plutovg_canvas_t *canvas;
  element_t *peVar12;
  element_t *peVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  plutovg_color_t pVar20;
  plutovg_spread_method_t spread;
  length_t fx;
  length_t x2;
  units_type_t units;
  length_t y1;
  length_t x1;
  plutovg_spread_method_t spread_1;
  linear_gradient_attributes_t attributes;
  plutovg_matrix_t transform;
  gradient_stop_array_t stops;
  units_type_t local_5ec;
  length_t local_5e8;
  length_t local_5e0;
  length_t local_5d8;
  length_t local_5d0;
  render_state_t *local_5c8;
  length_t local_5c0;
  element_t *local_5b8;
  plutovg_spread_method_t local_5b0;
  float local_5ac;
  undefined1 local_5a8 [8];
  element_t *peStack_5a0;
  element_t *local_598;
  element_t *peStack_590;
  element_t *local_588;
  element_t *peStack_580;
  element_t *local_578;
  element_t *peStack_570;
  element_t *local_568;
  plutovg_matrix_t local_558;
  gradient_stop_array_t local_538;
  
  pVar1 = paint->type;
  if (pVar1 == paint_type_none) {
    uVar11 = 0;
  }
  else {
    if (pVar1 == paint_type_var) {
      if ((context->palette_func == (plutosvg_palette_func_t)0x0) ||
         (_Var6 = (*context->palette_func)
                            (context->closure,(paint->id).data,(int)(paint->id).length,
                             (plutovg_color_t *)local_5a8), !_Var6)) {
        if ((paint->color).type == color_type_fixed) {
          plutovg_color_init_argb32((plutovg_color_t *)&local_538,(paint->color).value);
          peStack_5a0 = (element_t *)CONCAT44(local_538.data[0].color.b,local_538.data[0].color.g);
          local_5a8._0_4_ = local_538.data[0].offset;
          local_5a8._4_4_ = local_538.data[0].color.r;
        }
        else {
          pVar20 = resolve_current_color(context,state->element);
          peStack_5a0 = pVar20._8_8_;
          local_5a8._0_4_ = pVar20.r;
          local_5a8._4_4_ = pVar20.g;
        }
      }
      canvas = context->canvas;
      color = (gradient_stop_array_t *)local_5a8;
    }
    else {
      if ((pVar1 != paint_type_color) &&
         (peVar7 = find_element(context->document,&paint->id), peVar7 != (element_t *)0x0)) {
        uVar11 = 0;
        local_5c8 = state;
        if (peVar7->id == 0xc) {
          local_578 = (element_t *)0x0;
          peStack_570 = (element_t *)0x0;
          local_588 = (element_t *)0x0;
          peStack_580 = (element_t *)0x0;
          local_598 = (element_t *)0x0;
          peStack_590 = (element_t *)0x0;
          local_5a8 = (undefined1  [8])0x0;
          peStack_5a0 = (element_t *)0x0;
          local_568 = (element_t *)0x0;
          peVar12 = peVar7;
          do {
            collect_gradient_attributes(peVar12,(gradient_attributes_t *)local_5a8);
            if (peVar12->id == 0xc) {
              if (local_588 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 5) goto LAB_001091be;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_001091be:
                  local_588 = peVar12;
                }
              }
              if (peStack_580 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 6) goto LAB_001091e6;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_001091e6:
                  peStack_580 = peVar12;
                }
              }
              if (local_578 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0x17) goto LAB_00109211;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_00109211:
                  local_578 = peVar12;
                }
              }
              if (peStack_570 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0xc) goto LAB_0010923f;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_0010923f:
                  peStack_570 = peVar12;
                }
              }
              if (local_568 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0xd) goto LAB_0010926d;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_0010926d:
                  local_568 = peVar12;
                }
              }
            }
            peVar8 = resolve_href(context->document,peVar12);
            bVar2 = true;
            if ((peVar8 != (element_t *)0x0) && ((peVar8->id | 4U) == 0xc)) {
              bVar2 = false;
              peVar12 = peVar8;
            }
          } while ((!bVar2) && (uVar11 = uVar11 + 1, uVar11 != 0x80));
          uVar11 = (uint)(peStack_590 != (element_t *)0x0);
          if (peStack_590 != (element_t *)0x0) {
            if (local_5a8 == (undefined1  [8])0x0) {
              local_5a8 = (undefined1  [8])peVar7;
            }
            if (peStack_5a0 == (element_t *)0x0) {
              peStack_5a0 = peVar7;
            }
            if (local_598 == (element_t *)0x0) {
              local_598 = peVar7;
            }
            peVar12 = local_588;
            if (local_588 == (element_t *)0x0) {
              peVar12 = peVar7;
            }
            peVar8 = peStack_580;
            if (peStack_580 == (element_t *)0x0) {
              peVar8 = peVar7;
            }
            peVar13 = local_578;
            if (local_578 == (element_t *)0x0) {
              peVar13 = peVar7;
            }
            local_5ec = units_type_object_bounding_box;
            local_5b0 = PLUTOVG_SPREAD_METHOD_PAD;
            local_558.a = 1.0;
            local_558.b = 0.0;
            local_558.c = 0.0;
            local_558.d = 1.0;
            local_558.e = 0.0;
            local_558.f = 0.0;
            local_588 = peVar12;
            peStack_580 = peVar8;
            local_578 = peVar13;
            memset(&local_538,0,0x508);
            resolve_gradient_attributes
                      (context,local_5c8,(gradient_attributes_t *)local_5a8,&local_5ec,&local_5b0,
                       &local_558,&local_538);
            local_5c0.value = 50.0;
            local_5c0.type = length_type_percent;
            local_5d0.value = 50.0;
            local_5d0.type = length_type_percent;
            local_5e0.value = 50.0;
            local_5e0.type = length_type_percent;
            local_5e8.value = 50.0;
            local_5e8.type = length_type_percent;
            local_5d8.value = 50.0;
            local_5d8.type = length_type_percent;
            parse_length(peVar12,5,&local_5c0,true,false);
            local_5b8 = peVar8;
            parse_length(peVar8,6,&local_5d0,true,false);
            parse_length(peVar13,0x17,&local_5e0,false,false);
            if (peStack_570 == (element_t *)0x0) {
              iVar10 = 5;
            }
            else {
              iVar10 = 0xc;
              peVar12 = peStack_570;
            }
            parse_length(peVar12,iVar10,&local_5e8,true,false);
            prVar5 = local_5c8;
            if (local_568 == (element_t *)0x0) {
              iVar10 = 6;
              peVar7 = local_5b8;
            }
            else {
              iVar10 = 0xd;
              peVar7 = local_568;
            }
            parse_length(peVar7,iVar10,&local_5d8,true,false);
            uVar3 = local_5ec;
            fVar14 = local_5c0.value;
            if (local_5ec == units_type_user_space_on_use) {
              if (local_5c0.type == length_type_percent) {
                fVar14 = (prVar5->view_width * local_5c0.value) / 100.0;
              }
            }
            else if (local_5c0.type == length_type_percent) {
              fVar14 = local_5c0.value / 100.0;
            }
            fVar15 = local_5d0.value;
            if (local_5ec == units_type_user_space_on_use) {
              if (local_5d0.type == length_type_percent) {
                fVar15 = (prVar5->view_height * local_5d0.value) / 100.0;
              }
            }
            else if (local_5d0.type == length_type_percent) {
              fVar15 = local_5d0.value / 100.0;
            }
            lVar4 = local_5e0.type;
            if (local_5ec == units_type_user_space_on_use) {
              fVar18 = 0.0;
              if (local_5e0.type == length_type_percent) {
                local_5b8 = (element_t *)CONCAT44(local_5b8._4_4_,fVar14);
                local_5ac = fVar15;
                fVar18 = hypotf(prVar5->view_width,prVar5->view_height);
                fVar18 = fVar18 / 1.4142135;
                fVar15 = local_5ac;
                fVar14 = local_5b8._0_4_;
              }
              fVar17 = local_5e0.value;
              if (lVar4 == length_type_percent) {
                fVar17 = (fVar18 * local_5e0.value) / 100.0;
              }
            }
            else {
              fVar17 = local_5e0.value;
              if (local_5e0.type == length_type_percent) {
                fVar17 = local_5e0.value / 100.0;
              }
            }
            fVar18 = local_5e8.value;
            if (uVar3 == units_type_user_space_on_use) {
              if (local_5e8.type == length_type_percent) {
                fVar18 = (prVar5->view_width * local_5e8.value) / 100.0;
              }
            }
            else if (local_5e8.type == length_type_percent) {
              fVar18 = local_5e8.value / 100.0;
            }
            fVar19 = local_5d8.value;
            if (uVar3 == units_type_user_space_on_use) {
              if (local_5d8.type == length_type_percent) {
                fVar19 = (prVar5->view_height * local_5d8.value) / 100.0;
              }
            }
            else if (local_5d8.type == length_type_percent) {
              fVar19 = local_5d8.value / 100.0;
            }
            plutovg_canvas_set_radial_gradient
                      (context->canvas,fVar14,fVar15,fVar17,fVar18,fVar19,0.0,local_5b0,
                       local_538.data,(int)local_538.size,&local_558);
          }
        }
        else if (peVar7->id == 8) {
          local_578 = (element_t *)0x0;
          peStack_570 = (element_t *)0x0;
          local_588 = (element_t *)0x0;
          peStack_580 = (element_t *)0x0;
          local_598 = (element_t *)0x0;
          peStack_590 = (element_t *)0x0;
          local_5a8 = (undefined1  [8])0x0;
          peStack_5a0 = (element_t *)0x0;
          iVar10 = 0;
          peVar12 = peVar7;
          do {
            collect_gradient_attributes(peVar12,(gradient_attributes_t *)local_5a8);
            if (peVar12->id == 8) {
              if (local_588 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0x2b) goto LAB_00108dee;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_00108dee:
                  local_588 = peVar12;
                }
              }
              if (peStack_580 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0x2e) goto LAB_00108e16;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_00108e16:
                  peStack_580 = peVar12;
                }
              }
              if (local_578 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0x2c) goto LAB_00108e41;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_00108e41:
                  local_578 = peVar12;
                }
              }
              if (peStack_570 == (element_t *)0x0) {
                for (paVar9 = peVar12->attributes; paVar9 != (attribute *)0x0; paVar9 = paVar9->next
                    ) {
                  if (paVar9->id == 0x2f) goto LAB_00108e6f;
                }
                if (paVar9 != (attribute *)0x0) {
LAB_00108e6f:
                  peStack_570 = peVar12;
                }
              }
            }
            peVar8 = resolve_href(context->document,peVar12);
            bVar2 = true;
            if ((peVar8 != (element_t *)0x0) && ((peVar8->id | 4U) == 0xc)) {
              bVar2 = false;
              peVar12 = peVar8;
            }
          } while ((!bVar2) && (iVar10 = iVar10 + 1, iVar10 != 0x80));
          uVar11 = (uint)(peStack_590 != (element_t *)0x0);
          if (peStack_590 != (element_t *)0x0) {
            if (local_5a8 == (undefined1  [8])0x0) {
              local_5a8 = (undefined1  [8])peVar7;
            }
            if (peStack_5a0 == (element_t *)0x0) {
              peStack_5a0 = peVar7;
            }
            if (local_598 == (element_t *)0x0) {
              local_598 = peVar7;
            }
            peVar12 = local_588;
            if (local_588 == (element_t *)0x0) {
              peVar12 = peVar7;
            }
            peVar8 = peStack_580;
            if (peStack_580 == (element_t *)0x0) {
              peVar8 = peVar7;
            }
            peVar13 = local_578;
            if (local_578 == (element_t *)0x0) {
              peVar13 = peVar7;
            }
            local_5b8 = peStack_570;
            if (peStack_570 == (element_t *)0x0) {
              local_5b8 = peVar7;
            }
            local_5d8 = (length_t)((ulong)local_5d8 & 0xffffffff00000000);
            local_5ec = units_type_object_bounding_box;
            local_558.a = 1.0;
            local_558.b = 0.0;
            local_558.c = 0.0;
            local_558.d = 1.0;
            local_558.e = 0.0;
            local_558.f = 0.0;
            local_588 = peVar12;
            peStack_580 = peVar8;
            local_578 = peVar13;
            peStack_570 = local_5b8;
            memset(&local_538,0,0x508);
            resolve_gradient_attributes
                      (context,local_5c8,(gradient_attributes_t *)local_5a8,
                       (units_type_t *)&local_5d8,&local_5ec,&local_558,&local_538);
            local_5c0.value = 0.0;
            local_5c0.type = length_type_fixed;
            local_5d0.value = 0.0;
            local_5d0.type = length_type_fixed;
            local_5e0.value = 100.0;
            local_5e0.type = length_type_percent;
            local_5e8.value = 0.0;
            local_5e8.type = length_type_fixed;
            parse_length(peVar12,0x2b,&local_5c0,true,false);
            parse_length(peVar8,0x2e,&local_5d0,true,false);
            parse_length(peVar13,0x2c,&local_5e0,true,false);
            parse_length(local_5b8,0x2f,&local_5e8,true,false);
            fVar14 = local_5c0.value;
            if (local_5d8.value == 1.4013e-45) {
              if (local_5c0.type == length_type_percent) {
                fVar14 = (local_5c8->view_width * local_5c0.value) / 100.0;
              }
            }
            else if (local_5c0.type == length_type_percent) {
              fVar14 = local_5c0.value / 100.0;
            }
            fVar15 = local_5d0.value;
            if (local_5d8.value == 1.4013e-45) {
              if (local_5d0.type == length_type_percent) {
                fVar15 = (local_5c8->view_height * local_5d0.value) / 100.0;
              }
            }
            else if (local_5d0.type == length_type_percent) {
              fVar15 = local_5d0.value / 100.0;
            }
            fVar17 = local_5e0.value;
            if (local_5d8.value == 1.4013e-45) {
              if (local_5e0.type == length_type_percent) {
                fVar17 = (local_5c8->view_width * local_5e0.value) / 100.0;
              }
            }
            else if (local_5e0.type == length_type_percent) {
              fVar17 = local_5e0.value / 100.0;
            }
            fVar18 = local_5e8.value;
            if (local_5d8.value == 1.4013e-45) {
              if (local_5e8.type == length_type_percent) {
                fVar18 = (local_5c8->view_height * local_5e8.value) / 100.0;
              }
            }
            else if (local_5e8.type == length_type_percent) {
              fVar18 = local_5e8.value / 100.0;
            }
            plutovg_canvas_set_linear_gradient
                      (context->canvas,fVar14,fVar15,fVar17,fVar18,local_5ec,local_538.data,
                       (int)local_538.size,&local_558);
          }
        }
        goto LAB_00109141;
      }
      if ((paint->color).type == color_type_fixed) {
        plutovg_color_init_argb32((plutovg_color_t *)&local_538,(paint->color).value);
        uVar16 = CONCAT44(local_538.data[0].color.b,local_538.data[0].color.g);
      }
      else {
        pVar20 = resolve_current_color(context,state->element);
        uVar16 = pVar20._8_8_;
        local_538.data[0].offset = pVar20.r;
        local_538.data[0].color.r = pVar20.g;
      }
      local_538.data[0].color.g = (float)uVar16;
      local_538.data[0].color.b = (float)((ulong)uVar16 >> 0x20);
      color = &local_538;
      canvas = context->canvas;
    }
    plutovg_canvas_set_color(canvas,(plutovg_color_t *)color);
    uVar11 = 1;
  }
LAB_00109141:
  return SUB41(uVar11,0);
}

Assistant:

static bool apply_paint(render_state_t* state, const render_context_t* context, const paint_t* paint)
{
    if(paint->type == paint_type_none)
        return false;
    if(paint->type == paint_type_color) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(paint->type == paint_type_var) {
        plutovg_color_t color;
        if(!context->palette_func || !context->palette_func(context->closure, paint->id.data, paint->id.length, &color))
            color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    const element_t* ref = find_element(context->document, &paint->id);
    if(ref == NULL) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(ref->id == TAG_LINEAR_GRADIENT)
        return apply_linear_gradient(state, context, ref);
    if(ref->id == TAG_RADIAL_GRADIENT)
        return apply_radial_gradient(state, context, ref);
    return false;
}